

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall tinyusdz::Path::is_root_prim(Path *this)

{
  bool bVar1;
  long lVar2;
  
  if (this->_valid != true) {
    return false;
  }
  bVar1 = is_root_path(this);
  if ((((!bVar1) && (1 < (this->_prim_part)._M_string_length)) &&
      (*(this->_prim_part)._M_dataplus._M_p == '/')) &&
     (lVar2 = ::std::__cxx11::string::rfind((char)this,0x2f), lVar2 == 0)) {
    return true;
  }
  return false;
}

Assistant:

bool is_root_prim() const {
    if (!_valid) {
      return false;
    }

    if (is_root_path()) {
      return false;
    }

    if ((_prim_part.size() > 1) && (_prim_part[0] == '/')) {
      // no other '/' except for the fist one
      if (_prim_part.find_last_of('/') == 0) {
        return true;
      }
    }

    return false;
  }